

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

int lzip_tail(archive_read_filter *self)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  void *pvVar4;
  archive_read_filter *paVar5;
  long in_RDI;
  int tail;
  ssize_t avail_in;
  uchar *f;
  private_data_conflict1 *state;
  void *in_stack_ffffffffffffffc0;
  archive_read_filter *filter;
  int local_2c;
  ssize_t *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  archive_read_filter *filter_00;
  int local_4;
  
  filter_00 = *(archive_read_filter **)(in_RDI + 0x50);
  if (*(char *)((long)&filter_00->client_avail + 2) == '\0') {
    local_2c = 0xc;
  }
  else {
    local_2c = 0x14;
  }
  pvVar4 = __archive_read_filter_ahead
                     (filter_00,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if ((pvVar4 == (void *)0x0) && ((long)in_stack_ffffffffffffffd8 < 0)) {
    local_4 = -0x1e;
  }
  else if ((long)in_stack_ffffffffffffffd8 < (long)local_2c) {
    archive_set_error(*(archive **)(in_RDI + 0x18),-1,"Lzip: Remaining data is less bytes");
    local_4 = -0x19;
  }
  else {
    uVar1 = *(uint32_t *)((long)&filter_00->client_avail + 4);
    uVar2 = archive_le32dec(pvVar4);
    if (uVar1 == uVar2) {
      filter = (archive_read_filter *)filter_00[1].position;
      paVar5 = (archive_read_filter *)archive_le64dec(in_stack_ffffffffffffffc0);
      if (filter == paVar5) {
        if (*(char *)((long)&filter_00->client_avail + 2) == '\x01') {
          in_stack_ffffffffffffffc0 = (void *)(*(long *)&filter_00->end_of_file + (long)local_2c);
          pvVar4 = (void *)archive_le64dec(in_stack_ffffffffffffffc0);
          if (in_stack_ffffffffffffffc0 != pvVar4) {
            archive_set_error(*(archive **)(in_RDI + 0x18),-1,"Lzip: Member size error");
            return -0x19;
          }
        }
        __archive_read_filter_consume(filter,(int64_t)in_stack_ffffffffffffffc0);
        iVar3 = lzip_has_member(filter);
        if (iVar3 != 0) {
          *(undefined1 *)((long)&filter_00->client_avail + 1) = 0;
          *(undefined4 *)((long)&filter_00->client_avail + 4) = 0;
          filter_00[1].position = 0;
          filter_00->end_of_file = '\0';
          filter_00->closed = '\0';
          filter_00->fatal = '\0';
          *(undefined5 *)&filter_00->field_0xab = 0;
          *(undefined1 *)&filter_00->client_avail = 0;
        }
        local_4 = 0;
      }
      else {
        archive_set_error(*(archive **)(in_RDI + 0x18),-1,"Lzip: Uncompressed size error");
        local_4 = -0x19;
      }
    }
    else {
      archive_set_error(*(archive **)(in_RDI + 0x18),-1,"Lzip: CRC32 error");
      local_4 = -0x19;
    }
  }
  return local_4;
}

Assistant:

static int
lzip_tail(struct archive_read_filter *self)
{
	struct private_data *state;
	const unsigned char *f;
	ssize_t avail_in;
	int tail;

	state = (struct private_data *)self->data;
	if (state->lzip_ver == 0)
		tail = 12;
	else
		tail = 20;
	f = __archive_read_filter_ahead(self->upstream, tail, &avail_in);
	if (f == NULL && avail_in < 0)
		return (ARCHIVE_FATAL);
	if (avail_in < tail) {
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Lzip: Remaining data is less bytes");
		return (ARCHIVE_FAILED);
	}

	/* Check the crc32 value of the uncompressed data of the current
	 * member */
	if (state->crc32 != archive_le32dec(f)) {
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Lzip: CRC32 error");
		return (ARCHIVE_FAILED);
	}

	/* Check the uncompressed size of the current member */
	if ((uint64_t)state->member_out != archive_le64dec(f + 4)) {
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Lzip: Uncompressed size error");
		return (ARCHIVE_FAILED);
	}

	/* Check the total size of the current member */
	if (state->lzip_ver == 1 &&
	    (uint64_t)state->member_in + tail != archive_le64dec(f + 12)) {
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Lzip: Member size error");
		return (ARCHIVE_FAILED);
	}
	__archive_read_filter_consume(self->upstream, tail);

	/* If current lzip data consists of multi member, try decompressing
	 * a next member. */
	if (lzip_has_member(self->upstream) != 0) {
		state->in_stream = 0;
		state->crc32 = 0;
		state->member_out = 0;
		state->member_in = 0;
		state->eof = 0;
	}
	return (ARCHIVE_OK);
}